

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void create_file(char *name)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  char *__s1;
  uv_fs_event_t *puVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  code *apcStack_1f0 [2];
  char local_1e0 [8];
  uv_fs_event_t local_1d8 [4];
  
  iVar2 = 0x41;
  apcStack_1f0[0] = (code *)0x187f85;
  iVar1 = uv_fs_open(0,&local_1d8[0].loop,name,0x41,0x180,0);
  local_1d8[0].data = (void *)(long)iVar1;
  local_1e0[0] = '\0';
  local_1e0[1] = '\0';
  local_1e0[2] = '\0';
  local_1e0[3] = '\0';
  local_1e0[4] = '\0';
  local_1e0[5] = '\0';
  local_1e0[6] = '\0';
  local_1e0[7] = '\0';
  if (local_1d8[0].data == (void *)0x0) {
    apcStack_1f0[0] = (code *)0x187fb1;
    uv_fs_req_cleanup(&local_1d8[0].loop);
    iVar2 = 0;
    apcStack_1f0[0] = (code *)0x187fbf;
    iVar1 = uv_fs_close(0,&local_1d8[0].loop,local_1d8[0].wd);
    local_1d8[0].data = (void *)(long)iVar1;
    local_1e0[0] = '\0';
    local_1e0[1] = '\0';
    local_1e0[2] = '\0';
    local_1e0[3] = '\0';
    local_1e0[4] = '\0';
    local_1e0[5] = '\0';
    local_1e0[6] = '\0';
    local_1e0[7] = '\0';
    if (local_1d8[0].data == (void *)0x0) {
      apcStack_1f0[0] = (code *)0x187fe5;
      uv_fs_req_cleanup(&local_1d8[0].loop);
      return;
    }
  }
  else {
    apcStack_1f0[0] = (code *)0x187ffe;
    create_file_cold_1();
  }
  puVar3 = local_1d8;
  __s1 = local_1e0;
  apcStack_1f0[0] = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    apcStack_1f0[0] = (code *)(long)iVar2;
    if (apcStack_1f0[0] != (code *)0x0) goto LAB_001880db;
    apcStack_1f0[0] = (code *)(long)extraout_EDX;
    if (apcStack_1f0[0] != (code *)0x2) goto LAB_001880ea;
    iVar1 = strcmp(__s1,"file2");
    apcStack_1f0[0] = (code *)(long)iVar1;
    if (apcStack_1f0[0] == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      apcStack_1f0[0] = (code *)(long)iVar1;
      if (apcStack_1f0[0] == (code *)0x0) {
        uv_close(&fs_event,close_cb);
        return;
      }
      goto LAB_00188108;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_001880db:
    fs_event_cb_file_cold_2();
LAB_001880ea:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00188108:
  ppcVar4 = apcStack_1f0;
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close(ppcVar4,close_cb);
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return;
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_WRONLY | UV_FS_O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}